

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int run_test_fs_file_pos_after_op_with_offset(void)

{
  int iVar1;
  __off64_t _Var2;
  uv_loop_t *puVar3;
  uv_buf_t uVar4;
  char *local_30;
  size_t local_28;
  char *local_20;
  size_t local_18;
  int r;
  
  unlink("test_file");
  loop = uv_default_loop();
  iVar1 = uv_fs_open(loop,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  if (iVar1 < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xe7d,"r > 0");
    abort();
  }
  uv_fs_req_cleanup(&open_req1);
  uVar4 = uv_buf_init(test_buf,0xd);
  local_20 = uVar4.base;
  iov.base = local_20;
  local_18 = uVar4.len;
  iov.len = local_18;
  iVar1 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,0,(uv_fs_cb)0x0);
  if (iVar1 != 0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xe82,"r == sizeof(test_buf)");
    abort();
  }
  _Var2 = lseek64((int)open_req1.result,0,1);
  if (_Var2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xe83,"lseek(open_req1.result, 0, SEEK_CUR) == 0");
    abort();
  }
  uv_fs_req_cleanup(&write_req);
  uVar4 = uv_buf_init(buf,0x20);
  local_30 = uVar4.base;
  iov.base = local_30;
  local_28 = uVar4.len;
  iov.len = local_28;
  iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0,(uv_fs_cb)0x0);
  if (iVar1 != 0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xe88,"r == sizeof(test_buf)");
    abort();
  }
  iVar1 = strcmp(buf,test_buf);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xe89,"strcmp(buf, test_buf) == 0");
    abort();
  }
  _Var2 = lseek64((int)open_req1.result,0,1);
  if (_Var2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xe8a,"lseek(open_req1.result, 0, SEEK_CUR) == 0");
    abort();
  }
  uv_fs_req_cleanup(&read_req);
  iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xe8e,"r == 0");
    abort();
  }
  uv_fs_req_cleanup(&close_req);
  unlink("test_file");
  puVar3 = uv_default_loop();
  close_loop(puVar3);
  puVar3 = uv_default_loop();
  iVar1 = uv_loop_close(puVar3);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xe94,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(fs_file_pos_after_op_with_offset) {
  int r;

  /* Setup. */
  unlink("test_file");
  loop = uv_default_loop();

  r = uv_fs_open(loop,
                 &open_req1,
                 "test_file",
                 O_RDWR | O_CREAT,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r > 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, 0, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(lseek(open_req1.result, 0, SEEK_CUR) == 0);
  uv_fs_req_cleanup(&write_req);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1, 0, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(strcmp(buf, test_buf) == 0);
  ASSERT(lseek(open_req1.result, 0, SEEK_CUR) == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}